

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ImplicitNonAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitNonAnsiPortSyntax,slang::syntax::ImplicitNonAnsiPortSyntax_const&>
          (BumpAllocator *this,ImplicitNonAnsiPortSyntax *args)

{
  SyntaxNode *pSVar1;
  PortExpressionSyntax *pPVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  ImplicitNonAnsiPortSyntax *pIVar5;
  
  pIVar5 = (ImplicitNonAnsiPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicitNonAnsiPortSyntax *)this->endPtr < pIVar5 + 1) {
    pIVar5 = (ImplicitNonAnsiPortSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pIVar5 + 1);
  }
  SVar3 = (args->super_NonAnsiPortSyntax).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(args->super_NonAnsiPortSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_NonAnsiPortSyntax).super_SyntaxNode.parent;
  pPVar2 = (args->expr).ptr;
  (pIVar5->super_NonAnsiPortSyntax).super_SyntaxNode.previewNode =
       (args->super_NonAnsiPortSyntax).super_SyntaxNode.previewNode;
  (pIVar5->expr).ptr = pPVar2;
  (pIVar5->super_NonAnsiPortSyntax).super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(pIVar5->super_NonAnsiPortSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pIVar5->super_NonAnsiPortSyntax).super_SyntaxNode.parent = pSVar1;
  return pIVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }